

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O2

void Abc_NtkVerifyReportError(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int *pModel)

{
  ulong uVar1;
  int *piVar2;
  int *__ptr;
  int *__ptr_00;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  Vec_Ptr_t *p;
  ulong uVar5;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar6;
  uint i;
  int i_00;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  Abc_Obj_t *pNode;
  int *local_38;
  
  if (pNtk1->vCis->nSize != pNtk2->vCis->nSize) {
    __assert_fail("Abc_NtkCiNum(pNtk1) == Abc_NtkCiNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcVerify.c"
                  ,0x2eb,"void Abc_NtkVerifyReportError(Abc_Ntk_t *, Abc_Ntk_t *, int *)");
  }
  if (pNtk1->vCos->nSize != pNtk2->vCos->nSize) {
    __assert_fail("Abc_NtkCoNum(pNtk1) == Abc_NtkCoNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcVerify.c"
                  ,0x2ec,"void Abc_NtkVerifyReportError(Abc_Ntk_t *, Abc_Ntk_t *, int *)");
  }
  __ptr = Abc_NtkVerifySimulatePattern(pNtk1,pModel);
  __ptr_00 = Abc_NtkVerifySimulatePattern(pNtk2,pModel);
  uVar8 = pNtk1->vCos->nSize;
  uVar5 = 0;
  uVar7 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar7 = uVar5;
  }
  uVar8 = 0;
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    uVar8 = uVar8 + (__ptr[uVar5] != __ptr_00[uVar5]);
  }
  local_38 = pModel;
  printf("Verification failed for at least %d outputs: ",(ulong)uVar8);
  uVar7 = 0xffffffffffffffff;
  uVar5 = 0;
  uVar9 = 0;
  do {
    i = (uint)uVar7;
    if ((long)pNtk1->vCos->nSize <= (long)uVar5) {
LAB_002cd012:
      if (uVar9 != uVar8) {
        printf(" ...");
      }
      putchar(10);
      piVar2 = local_38;
      if (-1 < (int)i) {
        pAVar3 = Abc_NtkCo(pNtk1,i);
        pcVar4 = Abc_ObjName(pAVar3);
        printf("Output %s: Value in Network1 = %d. Value in Network2 = %d.\n",pcVar4,
               (ulong)(uint)__ptr[i],(ulong)(uint)__ptr_00[i]);
        printf("Input pattern: ");
        pNode = Abc_NtkCo(pNtk1,i);
        p = Abc_NtkNodeSupport(pNtk1,&pNode,1);
        for (aVar6.pTemp = (void *)0x0; (long)aVar6.pTemp < (long)pNtk1->vCis->nSize;
            aVar6.pTemp = (void *)((long)&(aVar6.pCopy)->pNtk + 1)) {
          pNode = Abc_NtkCi(pNtk1,aVar6.iTemp);
          pNode->field_6 = aVar6;
        }
        pNode = (Abc_Obj_t *)Vec_PtrEntry(p,0);
        uVar8 = *(uint *)&pNode->field_0x14 & 0xf;
        if ((uVar8 == 5) || (uVar8 == 2)) {
          for (i_00 = 0; i_00 < p->nSize; i_00 = i_00 + 1) {
            pNode = (Abc_Obj_t *)Vec_PtrEntry(p,i_00);
            uVar8 = *(uint *)&pNode->field_0x14 & 0xf;
            if ((uVar8 != 2) && (uVar8 != 5)) {
              __assert_fail("Abc_ObjIsCi(pNode)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcVerify.c"
                            ,0x315,"void Abc_NtkVerifyReportError(Abc_Ntk_t *, Abc_Ntk_t *, int *)")
              ;
            }
            pcVar4 = Abc_ObjName(pNode);
            printf(" %s=%d",pcVar4,(ulong)(uint)piVar2[(pNode->field_6).iTemp]);
          }
        }
        putchar(10);
        Vec_PtrFree(p);
      }
      free(__ptr);
      free(__ptr_00);
      return;
    }
    if (__ptr[uVar5] != __ptr_00[uVar5]) {
      uVar1 = uVar7;
      if (i == 0xffffffff) {
        uVar1 = uVar5;
      }
      uVar7 = uVar1 & 0xffffffff;
      i = (uint)uVar1;
      pAVar3 = Abc_NtkCo(pNtk1,(int)uVar5);
      pcVar4 = Abc_ObjName(pAVar3);
      printf(" %s",pcVar4);
      uVar9 = uVar9 + 1;
      if (uVar9 == 3) {
        uVar9 = 3;
        goto LAB_002cd012;
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void Abc_NtkVerifyReportError( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int * pModel, Vec_Int_t * mismatch )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode;    
    int nErrors, nPrinted, i, iNode = -1;

    assert( Abc_NtkCiNum(pNtk1) == Abc_NtkCiNum(pNtk2) );
    assert( Abc_NtkCoNum(pNtk1) == Abc_NtkCoNum(pNtk2) );
    // get the CO values under this model
    pValues1__ = Abc_NtkVerifySimulatePattern( pNtk1, pModel );
    pValues2__ = Abc_NtkVerifySimulatePattern( pNtk2, pModel );
    // count the mismatches
    nErrors = 0;
    for ( i = 0; i < Abc_NtkCoNum(pNtk1); i++ )
        nErrors += (int)( pValues1__[i] != pValues2__[i] );
    //printf( "Verification failed for at least %d outputs: ", nErrors );
    // print the first 3 outputs
    nPrinted = 0;
    for ( i = 0; i < Abc_NtkCoNum(pNtk1); i++ )
        if ( pValues1__[i] != pValues2__[i] )
        {
            if ( iNode == -1 )
                iNode = i;
            //printf( " %s", Abc_ObjName(Abc_NtkCo(pNtk1,i)) );
            if ( ++nPrinted == 3 )
                break;
        }
    /*if ( nPrinted != nErrors )
        printf( " ..." );
    printf( "\n" );*/
    // report mismatch for the first output
    if ( iNode >= 0 )
    {
        /*printf( "Output %s: Value in Network1 = %d. Value in Network2 = %d.\n", 
            Abc_ObjName(Abc_NtkCo(pNtk1,iNode)), pValues1[iNode], pValues2[iNode] );
        printf( "Input pattern: " );*/
        // collect PIs in the cone
        pNode = Abc_NtkCo(pNtk1,iNode);
        vNodes = Abc_NtkNodeSupport( pNtk1, &pNode, 1 );
        // set the PI numbers
        Abc_NtkForEachCi( pNtk1, pNode, i )
            pNode->iTemp = i;
        // print the model
        pNode = (Abc_Obj_t *)Vec_PtrEntry( vNodes, 0 );
        if ( Abc_ObjIsCi(pNode) )
        {
            Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
            {
                assert( Abc_ObjIsCi(pNode) );
                //printf( " %s=%d", Abc_ObjName(pNode), pModel[(int)pNode->pCopy] );
                Vec_IntPush(mismatch, Abc_ObjId(pNode)-1);
                Vec_IntPush(mismatch, pModel[(int)(size_t)pNode->pCopy]);
            }
        }
        //printf( "\n" );
        Vec_PtrFree( vNodes );
    }
    free( pValues1__ );
    free( pValues2__ );
}